

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.H
# Opt level: O2

int __thiscall Fl_Tree_Item::visible_r(Fl_Tree_Item *this)

{
  if (this->_visible == '\0') {
    return 0;
  }
  do {
    this = this->_parent;
    if ((this == (Fl_Tree_Item *)0x0) || (this->_visible == '\0')) break;
  } while (this->_open != '\0');
  return (int)(this == (Fl_Tree_Item *)0x0);
}

Assistant:

int is_flag(unsigned short flag) const {
    switch (flag) {
      case     OPEN: return(_open ? 1 : 0);
      case  VISIBLE: return(_visible ? 1 : 0);
      case   ACTIVE: return(_active ? 1 : 0);
      case SELECTED: return(_selected ? 1 : 0);
      default:       return(0);
    }
  }